

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LocalGraph.cpp
# Opt level: O2

void __thiscall wasm::LazyLocalGraph::makeFlower(LazyLocalGraph *this)

{
  pointer __p;
  pointer in_RAX;
  pointer local_28;
  
  if ((this->locations).
      super__Optional_base<std::map<wasm::Expression_*,_wasm::Expression_**,_std::less<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::Expression_**>_>_>,_false,_false>
      ._M_payload.
      super__Optional_payload<std::map<wasm::Expression_*,_wasm::Expression_**,_std::less<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::Expression_**>_>_>,_true,_false,_false>
      .
      super__Optional_payload_base<std::map<wasm::Expression_*,_wasm::Expression_**,_std::less<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::Expression_**>_>_>_>
      ._M_engaged != true) {
    local_28 = in_RAX;
    std::
    optional<std::map<wasm::Expression_*,_wasm::Expression_**,_std::less<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::Expression_**>_>_>_>
    ::emplace<>(&this->locations);
    std::
    make_unique<wasm::LocalGraphFlower,std::unordered_map<wasm::LocalGet*,wasm::SmallSet<wasm::LocalSet*,2ul>,std::hash<wasm::LocalGet*>,std::equal_to<wasm::LocalGet*>,std::allocator<std::pair<wasm::LocalGet*const,wasm::SmallSet<wasm::LocalSet*,2ul>>>>&,std::map<wasm::Expression*,wasm::Expression**,std::less<wasm::Expression*>,std::allocator<std::pair<wasm::Expression*const,wasm::Expression**>>>&,wasm::Function*const&,wasm::Module*const&,std::optional<wasm::Expression::Id>const&>
              ((unordered_map<wasm::LocalGet_*,_wasm::SmallSet<wasm::LocalSet_*,_2UL>,_std::hash<wasm::LocalGet_*>,_std::equal_to<wasm::LocalGet_*>,_std::allocator<std::pair<wasm::LocalGet_*const,_wasm::SmallSet<wasm::LocalSet_*,_2UL>_>_>_>
                *)&stack0xffffffffffffffd8,
               (map<wasm::Expression_*,_wasm::Expression_**,_std::less<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::Expression_**>_>_>
                *)&this->getSetsMap,(Function **)&this->locations,(Module **)this,
               (optional<wasm::Expression::Id> *)&(this->super_LocalGraphBase).module);
    __p = local_28;
    local_28 = (pointer)0x0;
    std::__uniq_ptr_impl<wasm::LocalGraphFlower,_std::default_delete<wasm::LocalGraphFlower>_>::
    reset((__uniq_ptr_impl<wasm::LocalGraphFlower,_std::default_delete<wasm::LocalGraphFlower>_> *)
          &this->flower,__p);
    std::unique_ptr<wasm::LocalGraphFlower,_std::default_delete<wasm::LocalGraphFlower>_>::
    ~unique_ptr((unique_ptr<wasm::LocalGraphFlower,_std::default_delete<wasm::LocalGraphFlower>_> *)
                &stack0xffffffffffffffd8);
    LocalGraphFlower::prepareLaziness
              ((this->flower)._M_t.
               super___uniq_ptr_impl<wasm::LocalGraphFlower,_std::default_delete<wasm::LocalGraphFlower>_>
               ._M_t.
               super__Tuple_impl<0UL,_wasm::LocalGraphFlower_*,_std::default_delete<wasm::LocalGraphFlower>_>
               .super__Head_base<0UL,_wasm::LocalGraphFlower_*,_false>._M_head_impl);
    return;
  }
  __assert_fail("!locations",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/ir/LocalGraph.cpp"
                ,0x285,"void wasm::LazyLocalGraph::makeFlower() const");
}

Assistant:

void LazyLocalGraph::makeFlower() const {
  // |locations| is set here and filled in by |flower|.
  assert(!locations);
  locations.emplace();

  flower = std::make_unique<LocalGraphFlower>(
    getSetsMap, *locations, func, module, queryClass);

  flower->prepareLaziness();

#ifdef LOCAL_GRAPH_DEBUG
  std::cout << "LazyLocalGraph::dump\n";
  for (auto& [get, sets] : getSetsMap) {
    std::cout << "GET\n" << get << " is influenced by\n";
    for (auto* set : sets) {
      std::cout << set << '\n';
    }
  }
  std::cout << "total locations: " << locations.size() << '\n';
#endif
}